

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHaig.c
# Opt level: O0

Hop_Obj_t * Hop_ObjReprHop(Hop_Obj_t *pObj)

{
  long *plVar1;
  Hop_Obj_t *pRepr;
  Hop_Obj_t *pObj_local;
  
  if ((pObj->field_1).pNext == (Hop_Obj_t *)0x0) {
    __assert_fail("pObj->pNext != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcHaig.c"
                  ,0xbd,"Hop_Obj_t *Hop_ObjReprHop(Hop_Obj_t *)");
  }
  if ((pObj->field_0).pData == (void *)0x0) {
    pObj_local = (pObj->field_1).pNext;
  }
  else {
    plVar1 = (long *)(pObj->field_0).pData;
    if ((long *)*plVar1 != plVar1) {
      __assert_fail("pRepr->pData == pRepr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcHaig.c"
                    ,0xc1,"Hop_Obj_t *Hop_ObjReprHop(Hop_Obj_t *)");
    }
    pObj_local = Hop_NotCond((Hop_Obj_t *)plVar1[1],
                             *(uint *)&pObj->field_0x20 >> 3 & 1 ^ *(uint *)(plVar1 + 4) >> 3 & 1);
  }
  return pObj_local;
}

Assistant:

static inline Hop_Obj_t * Hop_ObjReprHop( Hop_Obj_t * pObj )
{
    Hop_Obj_t * pRepr;
    assert( pObj->pNext != NULL );
    if ( pObj->pData == NULL )
        return pObj->pNext;
    pRepr = (Hop_Obj_t *)pObj->pData;
    assert( pRepr->pData == pRepr );
    return Hop_NotCond( pRepr->pNext, pObj->fPhase ^ pRepr->fPhase );
}